

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGMaskElement::maskRect(SVGMaskElement *this,SVGElement *element)

{
  Rect RVar1;
  Units UVar2;
  float x;
  float y;
  float w;
  float h;
  undefined8 extraout_XMM0_Qa;
  ulong uVar3;
  float local_48;
  float fStack_44;
  Rect bbox;
  LengthContext lengthContext;
  SVGElement *element_local;
  SVGMaskElement *this_local;
  Rect maskRect;
  
  UVar2 = SVGEnumeration<lunasvg::Units>::value(&this->m_maskUnits);
  LengthContext::LengthContext((LengthContext *)&bbox.w,&this->super_SVGElement,UVar2);
  x = LengthContext::valueForLength((LengthContext *)&bbox.w,&this->m_x);
  y = LengthContext::valueForLength((LengthContext *)&bbox.w,&this->m_y);
  w = LengthContext::valueForLength((LengthContext *)&bbox.w,&this->m_width);
  h = LengthContext::valueForLength((LengthContext *)&bbox.w,&this->m_height);
  uVar3 = (ulong)(uint)y;
  Rect::Rect((Rect *)&this_local,x,y,w,h);
  UVar2 = SVGEnumeration<lunasvg::Units>::value(&this->m_maskUnits);
  if (UVar2 == ObjectBoundingBox) {
    (*(element->super_SVGNode)._vptr_SVGNode[0xb])();
    bbox.x = (float)uVar3;
    local_48 = (float)extraout_XMM0_Qa;
    this_local._0_4_ = this_local._0_4_ * bbox.x + local_48;
    bbox.y = (float)(uVar3 >> 0x20);
    fStack_44 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
    this_local._4_4_ = this_local._4_4_ * bbox.y + fStack_44;
    maskRect.x = maskRect.x * bbox.x;
    maskRect.y = maskRect.y * bbox.y;
  }
  RVar1.y = this_local._4_4_;
  RVar1.x = this_local._0_4_;
  RVar1.w = maskRect.x;
  RVar1.h = maskRect.y;
  return RVar1;
}

Assistant:

Rect SVGMaskElement::maskRect(const SVGElement* element) const
{
    LengthContext lengthContext(this, m_maskUnits.value());
    Rect maskRect = {
        lengthContext.valueForLength(m_x),
        lengthContext.valueForLength(m_y),
        lengthContext.valueForLength(m_width),
        lengthContext.valueForLength(m_height)
    };

    if(m_maskUnits.value() == Units::ObjectBoundingBox) {
        auto bbox = element->fillBoundingBox();
        maskRect.x = maskRect.x * bbox.w + bbox.x;
        maskRect.y = maskRect.y * bbox.h + bbox.y;
        maskRect.w = maskRect.w * bbox.w;
        maskRect.h = maskRect.h * bbox.h;
    }

    return maskRect;
}